

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::XFormWidget::draw(XFormWidget *this)

{
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  void *pvVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> white;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blue;
  vector<unsigned_char,_std::allocator<unsigned_char>_> green;
  vector<unsigned_char,_std::allocator<unsigned_char>_> red;
  allocator_type local_75;
  undefined4 local_74;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  if ((this->target).object != (SceneObject *)0x0) {
    local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x400000ff;
    __l._M_len = 4;
    __l._M_array = (iterator)&local_40;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_28,__l,(allocator_type *)&local_58);
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x4000ff00;
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)&local_58;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_40,__l_00,(allocator_type *)&local_70);
    local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x40ff0000;
    __l_01._M_len = 4;
    __l_01._M_array = (iterator)&local_70;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_58,__l_01,(allocator_type *)&local_74);
    local_74 = 0x40ffffff;
    __l_02._M_len = 4;
    __l_02._M_array = (iterator)&local_74;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_70,__l_02,&local_75);
    if ((this->target).axis == X) {
      local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[2] = 0x80;
      local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[1] = 0x80;
    }
    if ((this->target).axis == Y) {
      *(undefined1 *)
       (CONCAT44(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 2) = 0x40;
      *(undefined1 *)
       CONCAT44(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_) = 0x40;
      *(undefined1 *)
       (CONCAT44(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 1) = 0xc4;
    }
    if ((this->target).axis == Z) {
      *(undefined1 *)
       (CONCAT44(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 1) = 0x80;
      *(undefined1 *)
       CONCAT44(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_) = 0x80;
    }
    if ((this->target).axis == Center) {
      *(undefined1 *)
       (CONCAT44(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 2) = 0xc0;
      *(undefined1 *)
       (CONCAT44(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + 1) = 0xc0;
      *(undefined1 *)
       CONCAT44(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_) = 0xc0;
    }
    this_00 = &this->axisColors;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize(this_00,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_00->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,&local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_00->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,&local_40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_00->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,&local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_00->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3,&local_70);
    glPushMatrix();
    glDisable(0xb50);
    glDisable(0xb71);
    glEnable(0xbe2);
    glBlendFunc(0x302,0x303);
    drawHandles(this);
    glDisable(0xbe2);
    glEnable(0xb71);
    drawHandles(this);
    glEnable(0xb50);
    glPopMatrix();
    pvVar1 = (void *)CONCAT44(local_70.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_70.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_70.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1
                     );
    }
    pvVar1 = (void *)CONCAT44(local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_58.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1
                     );
    }
    pvVar1 = (void *)CONCAT44(local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_40.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1
                     );
    }
    if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_28.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void XFormWidget::draw()
{
   if( target.object == nullptr ) return;

   vector<GLubyte>   red = { 255, 0,   0,   64 };
   vector<GLubyte> green = { 0,   255, 0,   64 };
   vector<GLubyte>  blue = { 0,   0,   255, 64 };
   vector<GLubyte> white = { 255, 255, 255, 64 };

   if( target.axis == Selection::Axis::X )      { red[1] = red[2] = 128; }
   if( target.axis == Selection::Axis::Y )      { green[0] = green[2] = 64; green[1] = 196; }
   if( target.axis == Selection::Axis::Z )      { blue[0] = blue[1] = 128; }
   if( target.axis == Selection::Axis::Center ) { white[0] = white[1] = white[2] = 192; }

   axisColors.resize(4);
   axisColors[0] = red;
   axisColors[1] = green;
   axisColors[2] = blue;
   axisColors[3] = white;

   glPushMatrix();
   glDisable( GL_LIGHTING );

   glDisable( GL_DEPTH_TEST );
   glEnable( GL_BLEND );
   glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );
   drawHandles();

   glDisable( GL_BLEND );
   glEnable( GL_DEPTH_TEST );
   drawHandles();
   glEnable( GL_LIGHTING );
   glPopMatrix();
}